

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::RevoluteJoint::computeChildPosVelAcc
          (RevoluteJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,VectorDynSize *jntAcc,
          LinkPositions *linkPositions,LinkVelArray *linkVels,LinkAccArray *linkAccs,LinkIndex child
          ,LinkIndex parent)

{
  ulong uVar1;
  Transform *pTVar2;
  Twist *pTVar3;
  SpatialAcc *this_00;
  VectorDynSize *in_RCX;
  VectorDynSize *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Transform *parent_X_child;
  Transform *child_X_parent;
  double d2ang;
  double dang;
  LinkIndex in_stack_fffffffffffffcd8;
  Twist local_2f0 [48];
  Twist local_2c0 [48];
  SpatialMotionVector local_290;
  SpatialAcc local_260;
  SpatialAcc local_230;
  SpatialAcc local_200;
  SpatialAcc local_1d0;
  Twist local_1a0 [48];
  Transform local_170 [48];
  Twist local_140 [48];
  SpatialMotionVector local_110;
  undefined1 local_e0 [48];
  Transform local_b0 [96];
  undefined8 local_50;
  Twist *local_48;
  double local_40;
  double local_38;
  VectorDynSize *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_40 = (double)iDynTree::VectorDynSize::operator()(local_20,uVar1);
  local_48 = (Twist *)(**(code **)(*in_RDI + 0x50))
                                (in_RDI,local_10,in_stack_00000010,in_stack_00000018);
  local_50 = (**(code **)(*in_RDI + 0x50))(in_RDI,local_10,in_stack_00000018,in_stack_00000010);
  pTVar2 = LinkPositions::operator()((LinkPositions *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Transform::operator*(local_b0,pTVar2);
  pTVar2 = LinkPositions::operator()((LinkPositions *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Transform::operator=(pTVar2,local_b0);
  (**(code **)(*in_RDI + 0x60))(local_e0,in_RDI,0,in_stack_00000010,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_110,local_38);
  pTVar3 = local_48;
  LinkVelArray::operator()((LinkVelArray *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Transform::operator*(local_170,pTVar3);
  iDynTree::Twist::Twist(local_1a0,&local_110);
  iDynTree::Twist::operator+(local_140,(Twist *)local_170);
  pTVar3 = LinkVelArray::operator()((LinkVelArray *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Twist::operator=(pTVar3,local_140);
  pTVar3 = local_48;
  LinkAccArray::operator()((LinkAccArray *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Transform::operator*((Transform *)&local_230,(SpatialAcc *)pTVar3);
  iDynTree::SpatialMotionVector::operator*(&local_290,local_40);
  iDynTree::SpatialAcc::SpatialAcc(&local_260,&local_290);
  iDynTree::SpatialAcc::operator+(&local_200,&local_230);
  pTVar3 = LinkVelArray::operator()((LinkVelArray *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::Twist::Twist(local_2f0,&local_110);
  iDynTree::Twist::operator*(local_2c0,pTVar3);
  iDynTree::SpatialAcc::operator+(&local_1d0,&local_200);
  this_00 = LinkAccArray::operator()((LinkAccArray *)in_RDX,in_stack_fffffffffffffcd8);
  iDynTree::SpatialAcc::operator=(this_00,&local_1d0);
  return;
}

Assistant:

void RevoluteJoint::computeChildPosVelAcc(const VectorDynSize & jntPos,
                                          const VectorDynSize & jntVel,
                                          const VectorDynSize & jntAcc,
                                          LinkPositions & linkPositions,
                                          LinkVelArray & linkVels,
                                          LinkAccArray & linkAccs,
                                          const LinkIndex child,
                                          const LinkIndex parent) const
{
    double dang = jntVel(this->getDOFsOffset());
    double d2ang = jntAcc(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);

    // Propagate position : position of the frame is expressed as
    // transform between the link frame and a reference frame :
    // ref_H_child  = ref_H_parent*parent_H_child
    linkPositions(child) = linkPositions(parent)*parent_X_child;

    // Propagate twist and spatial acceleration: for a revolute joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*dang;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2ang + linkVels(child)*vj;

    return;
}